

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSerialAnalyzerSettings.cpp
# Opt level: O2

void __thiscall
SimpleSerialAnalyzerSettings::LoadSettings(SimpleSerialAnalyzerSettings *this,char *settings)

{
  SimpleArchive text_archive;
  
  SimpleArchive::SimpleArchive(&text_archive);
  SimpleArchive::SetString((char *)&text_archive);
  SimpleArchive::operator>>(&text_archive,&this->mInputChannel);
  SimpleArchive::operator>>(&text_archive,&this->mBitRate);
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(&text_archive);
  return;
}

Assistant:

void SimpleSerialAnalyzerSettings::LoadSettings( const char* settings )
{
	SimpleArchive text_archive;
	text_archive.SetString( settings );

	text_archive >> mInputChannel;
	text_archive >> mBitRate;

	ClearChannels();
	AddChannel( mInputChannel, "Simple Serial", true );

	UpdateInterfacesFromSettings();
}